

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Fraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int fUseAlgoG;
  int fUseAlgo;
  int c;
  Gia_Man_t *pTemp;
  Cec_ParFra_t *pPars;
  Cec_ParFra_t ParsFra;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  bVar2 = false;
  ParsFra._64_8_ = argv;
  Cec_ManFraSetDefaultParams((Cec_ParFra_t *)&pPars);
  ParsFra.fDualOut = 1;
  ParsFra.nWords = 1000000;
  Extra_UtilGetoptReset();
LAB_002abb75:
  do {
    iVar3 = Extra_UtilGetopt(argc,(char **)ParsFra._64_8_,"WRILDCrmdckngwvh");
    if (iVar3 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Fraig(): There is no AIG.\n");
        return 1;
      }
      if (bVar1) {
        _fUseAlgo = Cec2_ManSimulateTest(pAbc->pGia,(Cec_ParFra_t *)&pPars);
      }
      else if (bVar2) {
        _fUseAlgo = Cec3_ManSimulateTest(pAbc->pGia,(Cec_ParFra_t *)&pPars);
      }
      else {
        _fUseAlgo = Cec_ManSatSweeping(pAbc->pGia,(Cec_ParFra_t *)&pPars,0);
      }
      Abc_FrameUpdateGia(pAbc,_fUseAlgo);
      return 0;
    }
    switch(iVar3) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002abf8f;
      }
      ParsFra.nRounds = atoi(*(char **)(ParsFra._64_8_ + (long)globalUtilOptind * 8));
      uVar4 = ParsFra.nRounds;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_002abf8f;
      }
      ParsFra.TimeLimit = atoi(*(char **)(ParsFra._64_8_ + (long)globalUtilOptind * 8));
      uVar4 = ParsFra.TimeLimit;
      break;
    default:
      goto LAB_002abf8f;
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_002abf8f;
      }
      ParsFra.nWords = atoi(*(char **)(ParsFra._64_8_ + (long)globalUtilOptind * 8));
      uVar4 = ParsFra.nWords;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002abf8f;
      }
      ParsFra.nBTLimit = atoi(*(char **)(ParsFra._64_8_ + (long)globalUtilOptind * 8));
      uVar4 = ParsFra.nBTLimit;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_002abf8f;
      }
      pPars._4_4_ = atoi(*(char **)(ParsFra._64_8_ + (long)globalUtilOptind * 8));
      uVar4 = pPars._4_4_;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002abf8f;
      }
      pPars._0_4_ = atoi(*(char **)(ParsFra._64_8_ + (long)globalUtilOptind * 8));
      uVar4 = (uint)pPars;
      break;
    case 99:
      ParsFra.fColorDiff = ParsFra.fColorDiff ^ 1;
      goto LAB_002abb75;
    case 100:
      ParsFra.fRewriting = ParsFra.fRewriting ^ 1;
      goto LAB_002abb75;
    case 0x67:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_002abb75;
    case 0x6b:
      ParsFra.fSatSweeping = ParsFra.fSatSweeping ^ 1;
      goto LAB_002abb75;
    case 0x6d:
      ParsFra.nDepthMax = ParsFra.nDepthMax ^ 1;
      goto LAB_002abb75;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002abb75;
    case 0x72:
      ParsFra.nLevelMax = ParsFra.nLevelMax ^ 1;
      goto LAB_002abb75;
    case 0x76:
      ParsFra.fUseOrigIds = ParsFra.fUseOrigIds ^ 1;
      goto LAB_002abb75;
    case 0x77:
      ParsFra.fUseCones = ParsFra.fUseCones ^ 1;
      goto LAB_002abb75;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar4 < 0) {
LAB_002abf8f:
      Abc_Print(-2,"usage: &fraig [-WRILDC <num>] [-rmdckngwvh]\n");
      Abc_Print(-2,"\t         performs combinational SAT sweeping\n");
      Abc_Print(-2,"\t-W num : the number of simulation words [default = %d]\n",(ulong)(uint)pPars);
      Abc_Print(-2,"\t-R num : the number of simulation rounds [default = %d]\n",(ulong)pPars._4_4_)
      ;
      Abc_Print(-2,"\t-I num : the number of sweeping iterations [default = %d]\n",
                (ulong)(uint)ParsFra.nWords);
      Abc_Print(-2,"\t-L num : the max number of levels of nodes to consider [default = %d]\n",
                (ulong)(uint)ParsFra.nBTLimit);
      Abc_Print(-2,"\t-D num : the max number of steps of speculative reduction [default = %d]\n",
                (ulong)(uint)ParsFra.TimeLimit);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)ParsFra.nRounds);
      pcVar5 = "no";
      if (ParsFra.nLevelMax != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle the use of AIG rewriting [default = %s]\n",pcVar5);
      pcVar5 = "circuit";
      if (ParsFra.nDepthMax != 0) {
        pcVar5 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (ParsFra.fRewriting != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using double output miters [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (ParsFra.fColorDiff != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based solver [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (ParsFra.fSatSweeping != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-k     : toggle using logic cones in the SAT solver [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle using new implementation [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (bVar2) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-g     : toggle using another new implementation [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (ParsFra.fUseCones != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing even more verbose information [default = %s]\n",
                pcVar5);
      pcVar5 = "no";
      if (ParsFra.fUseOrigIds != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Fraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Cec2_ManSimulateTest( Gia_Man_t * p, Cec_ParFra_t * pPars );
    extern Gia_Man_t * Cec3_ManSimulateTest( Gia_Man_t * p, Cec_ParFra_t * pPars );
    Cec_ParFra_t ParsFra, * pPars = &ParsFra;
    Gia_Man_t * pTemp;
    int c, fUseAlgo = 0, fUseAlgoG = 0;
    Cec_ManFraSetDefaultParams( pPars );
    pPars->fSatSweeping = 1;
    pPars->nItersMax = 1000000;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRILDCrmdckngwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nItersMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLevelMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fRewriting ^= 1;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOut ^= 1;
            break;
        case 'c':
            pPars->fRunCSat ^= 1;
            break;
        case 'k':
            pPars->fUseCones ^= 1;
            break;
        case 'n':
            fUseAlgo ^= 1;
            break;
        case 'g':
            fUseAlgoG ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Fraig(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseAlgo )
        pTemp = Cec2_ManSimulateTest( pAbc->pGia, pPars );
    else if ( fUseAlgoG )
        pTemp = Cec3_ManSimulateTest( pAbc->pGia, pPars );
    else
        pTemp = Cec_ManSatSweeping( pAbc->pGia, pPars, 0 );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &fraig [-WRILDC <num>] [-rmdckngwvh]\n" );
    Abc_Print( -2, "\t         performs combinational SAT sweeping\n" );
    Abc_Print( -2, "\t-W num : the number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-R num : the number of simulation rounds [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-I num : the number of sweeping iterations [default = %d]\n", pPars->nItersMax );
    Abc_Print( -2, "\t-L num : the max number of levels of nodes to consider [default = %d]\n", pPars->nLevelMax );
    Abc_Print( -2, "\t-D num : the max number of steps of speculative reduction [default = %d]\n", pPars->nDepthMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-r     : toggle the use of AIG rewriting [default = %s]\n", pPars->fRewriting? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-d     : toggle using double output miters [default = %s]\n", pPars->fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based solver [default = %s]\n", pPars->fRunCSat? "yes": "no" );
    Abc_Print( -2, "\t-k     : toggle using logic cones in the SAT solver [default = %s]\n", pPars->fUseCones? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle using new implementation [default = %s]\n", fUseAlgo? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using another new implementation [default = %s]\n", fUseAlgoG? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing even more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}